

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# igsc_cli.c
# Opt level: O2

void print_fwdata_version(char *prefix,igsc_fwdata_version2 *fwdata_version)

{
  uint uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  
  uVar1 = fwdata_version->format_version;
  if ((fwdata_version->flags & 1) == 0) {
    uVar3 = 999999;
    if (uVar1 < 2) {
      uVar2 = 999999;
    }
    else {
      uVar2 = (ulong)fwdata_version->data_arb_svn;
    }
  }
  else {
    uVar3 = (ulong)fwdata_version->oem_manuf_data_version_fitb;
    uVar2 = 999999;
    if (1 < uVar1) {
      uVar2 = (ulong)fwdata_version->data_arb_svn;
      uVar4 = (ulong)fwdata_version->data_arb_svn_fitb;
      goto LAB_0010a0ac;
    }
  }
  uVar4 = 999999;
LAB_0010a0ac:
  printf("%sFw Data Version: Format %u, Major Version: %u, OEM Manufacturing Data Version: %u, Major VCN: %u\n    OEM Manufacturing Data Version FITB: %u, Flags: 0X%08x, ARB SVN: %u, ARB SVN FITB: %u\n"
         ,prefix,(ulong)uVar1,(ulong)fwdata_version->major_version,
         (ulong)fwdata_version->oem_manuf_data_version,(ulong)fwdata_version->major_vcn,uVar3,
         (ulong)fwdata_version->flags,uVar2,uVar4);
  return;
}

Assistant:

static void print_fwdata_version(const char *prefix,
                                 const struct igsc_fwdata_version2 *fwdata_version)
{
    printf("%sFw Data Version: Format %u, Major Version: %u, OEM Manufacturing Data Version: %u, Major VCN: %u\n \
   OEM Manufacturing Data Version FITB: %u, Flags: 0X%08x, ARB SVN: %u, ARB SVN FITB: %u\n",
           prefix,
           fwdata_version->format_version,
           fwdata_version->major_version,
           fwdata_version->oem_manuf_data_version,
           fwdata_version->major_vcn,
           (fwdata_version->flags & IGSC_FWDATA_FITB_VALID_MASK) ?
               fwdata_version->oem_manuf_data_version_fitb : 999999,
           fwdata_version->flags,
           (fwdata_version->format_version > IGSC_FWDATA_FORMAT_VERSION_1) ?
               fwdata_version->data_arb_svn : 999999,
           ((fwdata_version->format_version > IGSC_FWDATA_FORMAT_VERSION_1) &&
	    (fwdata_version->flags & IGSC_FWDATA_FITB_VALID_MASK)) ?
               fwdata_version->data_arb_svn_fitb : 999999);
}